

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O0

ScopesResponse * __thiscall
cmDebugger::cmDebuggerThread::GetScopesResponse
          (ScopesResponse *__return_storage_ptr__,cmDebuggerThread *this,int64_t frameId,
          bool supportsVariableType)

{
  bool *__return_storage_ptr___00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
  *this_00;
  element_type *peVar4;
  int64_t i;
  element_type *this_01;
  string *value;
  mapped_type *this_02;
  undefined1 local_3f8 [8];
  Source source;
  undefined1 local_2a8 [8];
  Scope scope;
  string local_b0;
  undefined1 local_90 [8];
  shared_ptr<cmDebugger::cmDebuggerVariables> localVariables;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> frame;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
  local_68;
  iterator it2;
  _Node_iterator_base<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false>
  local_58 [3];
  _Node_iterator_base<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false>
  local_40;
  iterator it;
  unique_lock<std::mutex> lock;
  int64_t iStack_20;
  bool supportsVariableType_local;
  int64_t frameId_local;
  cmDebuggerThread *this_local;
  ScopesResponse *response;
  
  iStack_20 = frameId;
  frameId_local = (int64_t)this;
  this_local = (cmDebuggerThread *)__return_storage_ptr__;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->Mutex);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>_>
       ::find(&this->FrameScopes,&stack0xffffffffffffffe0);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>_>
       ::end(&this->FrameScopes);
  bVar1 = std::__detail::operator!=(&local_40,local_58);
  if (bVar1) {
    it2.
    super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
    ._M_cur._7_1_ = 0;
    dap::ScopesResponse::ScopesResponse(__return_storage_ptr__);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false,_false>
                           *)&local_40);
    std::vector<dap::Scope,_std::allocator<dap::Scope>_>::operator=
              (&__return_storage_ptr__->scopes,&ppVar2->second);
    it2.
    super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
    ._M_cur._7_1_ = 1;
    it2.
    super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
    ._M_cur._0_4_ = 1;
  }
  else {
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
         ::find(&this->FrameMap,&stack0xffffffffffffffe0);
    frame.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
         ::end(&this->FrameMap);
    bVar1 = std::__detail::operator==
                      (&local_68,
                       (_Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
                        *)&frame.
                           super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (bVar1) {
      memset(__return_storage_ptr__,0,0x18);
      dap::ScopesResponse::ScopesResponse(__return_storage_ptr__);
      it2.
      super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
      ._M_cur._0_4_ = 1;
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false,_false>
                             *)&local_68);
      std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)
                 &localVariables.
                  super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&ppVar3->second);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Locals",
                 (allocator<char> *)((long)&scope.variablesReference.val + 7));
      cmDebuggerVariablesHelper::Create
                ((cmDebuggerVariablesHelper *)local_90,&this->VariablesManager,&local_b0,
                 supportsVariableType,
                 (shared_ptr<cmDebugger::cmDebuggerStackFrame> *)
                 &localVariables.
                  super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&scope.variablesReference.val + 7))
      ;
      this_00 = (vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
                 *)std::
                   unordered_map<long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>_>_>
                   ::operator[](&this->FrameVariables,&stack0xffffffffffffffe0);
      std::
      vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
      ::emplace_back<std::shared_ptr<cmDebugger::cmDebuggerVariables>&>
                (this_00,(shared_ptr<cmDebugger::cmDebuggerVariables> *)local_90);
      dap::Scope::Scope((Scope *)local_2a8);
      peVar4 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      __return_storage_ptr___00 = &source.sources.set;
      cmDebuggerVariables::GetName_abi_cxx11_((string *)__return_storage_ptr___00,peVar4);
      std::__cxx11::string::operator=((string *)&scope.line.set,(string *)__return_storage_ptr___00)
      ;
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      dap::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&scope.namedVariables.set,(char (*) [7])"locals")
      ;
      peVar4 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      i = cmDebuggerVariables::GetId(peVar4);
      dap::integer::operator=((integer *)&scope.source.set,i);
      dap::Source::Source((Source *)local_3f8);
      this_01 = std::
                __shared_ptr_access<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&localVariables.
                                 super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      value = cmDebuggerStackFrame::GetFileName_abi_cxx11_(this_01);
      dap::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&source.checksums.set,value);
      dap::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&source.origin.set,
                (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&source.checksums.set);
      dap::optional<dap::Source>::operator=
                ((optional<dap::Source> *)&scope.presentationHint.set,(Source *)local_3f8);
      this_02 = std::
                unordered_map<long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>_>
                ::operator[](&this->FrameScopes,&stack0xffffffffffffffe0);
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (this_02,(value_type *)local_2a8);
      dap::ScopesResponse::ScopesResponse(__return_storage_ptr__);
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (&__return_storage_ptr__->scopes,(value_type *)local_2a8);
      it2.
      super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
      ._M_cur._0_4_ = 1;
      dap::Source::~Source((Source *)local_3f8);
      dap::Scope::~Scope((Scope *)local_2a8);
      std::shared_ptr<cmDebugger::cmDebuggerVariables>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerVariables> *)local_90);
      std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)
                 &localVariables.
                  super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return __return_storage_ptr__;
}

Assistant:

dap::ScopesResponse cmDebuggerThread::GetScopesResponse(
  int64_t frameId, bool supportsVariableType)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameScopes.find(frameId);

  if (it != FrameScopes.end()) {
    dap::ScopesResponse response;
    response.scopes = it->second;
    return response;
  }

  auto it2 = FrameMap.find(frameId);
  if (it2 == FrameMap.end()) {
    return dap::ScopesResponse();
  }

  std::shared_ptr<cmDebuggerStackFrame> frame = it2->second;
  std::shared_ptr<cmDebuggerVariables> localVariables =
    cmDebuggerVariablesHelper::Create(VariablesManager, "Locals",
                                      supportsVariableType, frame);

  FrameVariables[frameId].emplace_back(localVariables);

  dap::Scope scope;
  scope.name = localVariables->GetName();
  scope.presentationHint = "locals";
  scope.variablesReference = localVariables->GetId();

  dap::Source source;
  source.name = frame->GetFileName();
  source.path = source.name;
  scope.source = source;

  FrameScopes[frameId].push_back(scope);

  dap::ScopesResponse response;
  response.scopes.push_back(scope);
  return response;
}